

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WeakReferenceDictionary.h
# Opt level: O2

bool __thiscall
JsUtil::
SplitWeakDictionary<bool,_Js::RecyclableObject_*,_true,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_RecyclerPointerComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
::TryGetValueAndRemove
          (SplitWeakDictionary<bool,_Js::RecyclableObject_*,_true,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_RecyclerPointerComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
           *this,TBKey *key,TBValue *value)

{
  bool bVar1;
  int local_2c;
  int local_28;
  int i;
  int last;
  uint targetBucket;
  
  bVar1 = SplitWeakDictionary<bool,Js::RecyclableObject*,true,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,RecyclerPointerComparer,JsUtil::NoResizeLock,Memory::Recycler>
          ::FindEntryWithKey<Js::RecyclableObject*>
                    ((SplitWeakDictionary<bool,Js::RecyclableObject*,true,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,RecyclerPointerComparer,JsUtil::NoResizeLock,Memory::Recycler>
                      *)this,key,&local_2c,&local_28,(uint *)&i);
  if (bVar1) {
    *value = (this->entries).ptr[local_2c].super_ValueEntryData<bool>.value;
    RemoveAt(this,local_2c,local_28,i);
  }
  return bVar1;
}

Assistant:

bool TryGetValueAndRemove(const TBKey& key, TBValue* value)
        {
            int i, last;
            uint targetBucket;
            if (FindEntryWithKey(key, &i, &last, &targetBucket))
            {
                *value = this->GetValue(i);
                RemoveAt(i, last, targetBucket);
                return true;
            }
            return false;
        }